

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::RecordStartStopBit(I2cAnalyzer *this)

{
  int iVar1;
  MarkerType MVar2;
  element_type *peVar3;
  ulonglong uVar4;
  FrameV2 local_38 [8];
  FrameV2 framev2_1;
  FrameV2 local_20 [8];
  FrameV2 framev2;
  bool start;
  I2cAnalyzer *this_local;
  
  iVar1 = AnalyzerChannelData::GetBitState();
  if (iVar1 != 0) {
    peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
    MVar2 = AnalyzerChannelData::GetSampleNumber();
    std::auto_ptr<I2cAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar3,MVar2,(Channel *)0x9);
  }
  else {
    peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
    MVar2 = AnalyzerChannelData::GetSampleNumber();
    std::auto_ptr<I2cAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar3,MVar2,(Channel *)0x8);
    FrameV2::FrameV2(local_20);
    peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
    uVar4 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)peVar3,(char *)local_20,0x10d02c,uVar4);
    FrameV2::~FrameV2(local_20);
  }
  this->mNeedAddress = true;
  std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::CommitPacketAndStartNewPacket();
  std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::CommitResults();
  if (iVar1 != 0) {
    FrameV2::FrameV2(local_38);
    peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
    uVar4 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)peVar3,(char *)local_38,0x10d032,uVar4);
    FrameV2::~FrameV2(local_38);
  }
  return;
}

Assistant:

void I2cAnalyzer::RecordStartStopBit()
{
    bool start = mSda->GetBitState() == BIT_LOW;
    if( start )
    {
        // negedge -> START / restart
        mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Start, mSettings->mSdaChannel );

        FrameV2 framev2;
        mResults->AddFrameV2( framev2, "start", mSda->GetSampleNumber(), mSda->GetSampleNumber() + 1 );
    }
    else
    {
        // posedge -> STOP
        mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mSdaChannel );
    }

    mNeedAddress = true;
    mResults->CommitPacketAndStartNewPacket();
    mResults->CommitResults();

    if( !start )
    {
        FrameV2 framev2;
        mResults->AddFrameV2( framev2, "stop", mSda->GetSampleNumber(), mSda->GetSampleNumber() + 1 );
    }
}